

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

bool __thiscall duckdb::AsOfLocalState::Sink(AsOfLocalState *this,DataChunk *input)

{
  DataChunk *pDVar1;
  idx_t count;
  size_type *psVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  sel_t *psVar5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  long lVar7;
  ulong uVar8;
  reference this_00;
  PartitionLocalSinkState *this_01;
  ulong uVar9;
  size_type *psVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  idx_t count_p;
  UnifiedVectorFormat unified;
  UnifiedVectorFormat local_78;
  
  pDVar1 = &this->lhs_keys;
  DataChunk::Reset(pDVar1);
  ExpressionExecutor::Execute(&this->lhs_executor,input,pDVar1);
  DataChunk::Flatten(pDVar1);
  count = input->count;
  TemplatedValidityMask<unsigned_long>::Reset
            (&(this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>,0x800);
  psVar2 = (this->op->null_sensitive).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar10 = (this->op->null_sensitive).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; psVar10 != psVar2; psVar10 = psVar10 + 1) {
    this_00 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,*psVar10);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this_00,count,&local_78);
    ValidityMask::Combine(&this->lhs_valid_mask,&local_78.validity,count);
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  if ((this->left_outer).enabled == true) {
    switchD_014c69ad::default
              ((this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>
               ._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,(this->left_outer).count);
  }
  puVar3 = (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  count_p = 0;
  uVar8 = 0;
  lVar7 = 0;
LAB_019d78f6:
  uVar9 = uVar8;
  lVar12 = lVar7 + 1;
  if (lVar12 - (count + 0x3f >> 6) == 1) {
    pDVar1 = &this->lhs_payload;
    DataChunk::Reset(pDVar1);
    if (count_p == count) {
      DataChunk::Reference(pDVar1,input);
      count_p = input->count;
    }
    else {
      DataChunk::Slice(pDVar1,input,&this->lhs_sel,count_p,0);
      this->fetch_next_left = false;
    }
    (this->lhs_payload).count = count_p;
    this_01 = optional_ptr<duckdb::PartitionLocalSinkState,_true>::operator->
                        (&this->lhs_partition_sink);
    PartitionLocalSinkState::Sink(this_01,pDVar1);
    return false;
  }
  if (puVar3 != (unsigned_long *)0x0) goto code_r0x019d790f;
  uVar11 = uVar9 + 0x40;
  if (count <= uVar9 + 0x40) {
    uVar11 = count;
  }
  goto LAB_019d7972;
code_r0x019d790f:
  uVar4 = puVar3[lVar7];
  uVar11 = uVar9 + 0x40;
  if (count <= uVar9 + 0x40) {
    uVar11 = count;
  }
  uVar8 = uVar11;
  lVar7 = lVar12;
  if (uVar4 != 0) {
    if (uVar4 == 0xffffffffffffffff) {
LAB_019d7972:
      psVar5 = (this->lhs_sel).sel_vector;
      _Var6._M_head_impl =
           (this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
           _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      for (; uVar8 = uVar9, lVar7 = lVar12, uVar9 < uVar11; uVar9 = uVar9 + 1) {
        psVar5[count_p] = (sel_t)uVar9;
        if ((this->left_outer).enabled == true) {
          _Var6._M_head_impl[uVar9] = true;
        }
        count_p = count_p + 1;
      }
    }
    else {
      psVar5 = (this->lhs_sel).sel_vector;
      _Var6._M_head_impl =
           (this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
           _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      uVar13 = 0;
      for (; uVar8 = uVar9, uVar9 < uVar11; uVar9 = uVar9 + 1) {
        if ((uVar4 >> (uVar13 & 0x3f) & 1) != 0) {
          psVar5[count_p] = (sel_t)uVar9;
          count_p = count_p + 1;
          if ((this->left_outer).enabled == true) {
            _Var6._M_head_impl[uVar9] = true;
          }
        }
        uVar13 = uVar13 + 1;
      }
    }
  }
  goto LAB_019d78f6;
}

Assistant:

bool AsOfLocalState::Sink(DataChunk &input) {
	//	Compute the join keys
	lhs_keys.Reset();
	lhs_executor.Execute(input, lhs_keys);
	lhs_keys.Flatten();

	//	Combine the NULLs
	const auto count = input.size();
	lhs_valid_mask.Reset();
	for (auto col_idx : op.null_sensitive) {
		auto &col = lhs_keys.data[col_idx];
		UnifiedVectorFormat unified;
		col.ToUnifiedFormat(count, unified);
		lhs_valid_mask.Combine(unified.validity, count);
	}

	//	Convert the mask to a selection vector
	//	and mark all the rows that cannot match for early return.
	idx_t lhs_valid = 0;
	const auto entry_count = lhs_valid_mask.EntryCount(count);
	idx_t base_idx = 0;
	left_outer.Reset();
	for (idx_t entry_idx = 0; entry_idx < entry_count;) {
		const auto validity_entry = lhs_valid_mask.GetValidityEntry(entry_idx++);
		const auto next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
		if (ValidityMask::AllValid(validity_entry)) {
			for (; base_idx < next; ++base_idx) {
				lhs_sel.set_index(lhs_valid++, base_idx);
				left_outer.SetMatch(base_idx);
			}
		} else if (ValidityMask::NoneValid(validity_entry)) {
			base_idx = next;
		} else {
			const auto start = base_idx;
			for (; base_idx < next; ++base_idx) {
				if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
					lhs_sel.set_index(lhs_valid++, base_idx);
					left_outer.SetMatch(base_idx);
				}
			}
		}
	}

	//	Slice the keys to the ones we can match
	lhs_payload.Reset();
	if (lhs_valid == count) {
		lhs_payload.Reference(input);
		lhs_payload.SetCardinality(input);
	} else {
		lhs_payload.Slice(input, lhs_sel, lhs_valid);
		lhs_payload.SetCardinality(lhs_valid);

		//	Flush the ones that can't match
		fetch_next_left = false;
	}

	lhs_partition_sink->Sink(lhs_payload);

	return false;
}